

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t validate_img(aom_codec_alg_priv_t_conflict *ctx,aom_image_t *img)

{
  aom_img_fmt_t aVar1;
  aom_image_t *img_local;
  aom_codec_alg_priv_t_conflict *ctx_local;
  aom_codec_err_t local_4;
  
  aVar1 = img->fmt;
  if (aVar1 == AOM_IMG_FMT_I420) goto LAB_001d5cb7;
  if (aVar1 == AOM_IMG_FMT_I422) {
LAB_001d5c6b:
    if ((ctx->cfg).g_profile != 2) {
      (ctx->base).err_detail = "Invalid image format. I422 images not supported in profile.";
      return AOM_CODEC_INVALID_PARAM;
    }
  }
  else {
    if (aVar1 != AOM_IMG_FMT_I444) {
      if (((aVar1 == AOM_IMG_FMT_NV12) || (aVar1 == AOM_IMG_FMT_YV12)) ||
         (aVar1 == AOM_IMG_FMT_I42016)) goto LAB_001d5cb7;
      if (aVar1 == AOM_IMG_FMT_I42216) goto LAB_001d5c6b;
      if (aVar1 != AOM_IMG_FMT_I44416) {
        if (aVar1 != AOM_IMG_FMT_YV1216) {
          (ctx->base).err_detail =
               "Invalid image format. Only YV12, NV12, I420, I422, I444 images are supported.";
          return AOM_CODEC_INVALID_PARAM;
        }
        goto LAB_001d5cb7;
      }
    }
    if (((ctx->cfg).g_profile == 0) && ((ctx->cfg).monochrome == 0)) {
      (ctx->base).err_detail = "Invalid image format. I444 images not supported in profile.";
      return AOM_CODEC_INVALID_PARAM;
    }
  }
LAB_001d5cb7:
  if ((img->d_w == (ctx->cfg).g_w) && (img->d_h == (ctx->cfg).g_h)) {
    if (((ctx->oxcf).color_cfg.matrix_coefficients == AOM_CICP_MC_IDENTITY) &&
       ((img->x_chroma_shift != 0 || (img->y_chroma_shift != 0)))) {
      (ctx->base).err_detail = "Subsampling must be 0 with AOM_CICP_MC_IDENTITY.";
      local_4 = AOM_CODEC_INVALID_PARAM;
    }
    else {
      local_4 = AOM_CODEC_OK;
    }
  }
  else {
    (ctx->base).err_detail = "Image size must match encoder init configuration size";
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t validate_img(aom_codec_alg_priv_t *ctx,
                                    const aom_image_t *img) {
  switch (img->fmt) {
    case AOM_IMG_FMT_YV12:
    case AOM_IMG_FMT_NV12:
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_YV1216:
    case AOM_IMG_FMT_I42016: break;
    case AOM_IMG_FMT_I444:
    case AOM_IMG_FMT_I44416:
      if (ctx->cfg.g_profile == (unsigned int)PROFILE_0 &&
          !ctx->cfg.monochrome) {
        ERROR("Invalid image format. I444 images not supported in profile.");
      }
      break;
    case AOM_IMG_FMT_I422:
    case AOM_IMG_FMT_I42216:
      if (ctx->cfg.g_profile != (unsigned int)PROFILE_2) {
        ERROR("Invalid image format. I422 images not supported in profile.");
      }
      break;
    default:
      ERROR(
          "Invalid image format. Only YV12, NV12, I420, I422, I444 images are "
          "supported.");
      break;
  }

  if (img->d_w != ctx->cfg.g_w || img->d_h != ctx->cfg.g_h)
    ERROR("Image size must match encoder init configuration size");

  // 6.4.2 Color config semantics
  // If matrix_coefficients is equal to MC_IDENTITY, it is a requirement of
  // bitstream conformance that subsampling_x is equal to 0 and subsampling_y
  // is equal to 0.
  if (ctx->oxcf.color_cfg.matrix_coefficients == AOM_CICP_MC_IDENTITY &&
      (img->x_chroma_shift != 0 || img->y_chroma_shift != 0)) {
    ERROR("Subsampling must be 0 with AOM_CICP_MC_IDENTITY.");
  }

#if CONFIG_TUNE_BUTTERAUGLI
  if (ctx->extra_cfg.tuning == AOM_TUNE_BUTTERAUGLI) {
    if (img->bit_depth > 8) {
      ERROR("Only 8 bit depth images supported in tune=butteraugli mode.");
    }
    if (img->mc != 0 && img->mc != AOM_CICP_MC_BT_709 &&
        img->mc != AOM_CICP_MC_BT_601 && img->mc != AOM_CICP_MC_BT_470_B_G) {
      ERROR(
          "Only BT.709 and BT.601 matrix coefficients supported in "
          "tune=butteraugli mode. Identity matrix is treated as BT.601.");
    }
  }
#endif

  return AOM_CODEC_OK;
}